

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O3

size_t __thiscall std::hash<wasm::Array>::operator()(hash<wasm::Array> *this,Array *array)

{
  ulong uVar1;
  
  uVar1 = (array->element).type.id;
  uVar1 = (ulong)(array->element).packedType + 0x9e3779b97f4a7c15 + (uVar1 >> 4) + uVar1 * 0x1000 ^
          uVar1;
  return (uVar1 >> 4) + 0x9e3779b97f4a7c15 + uVar1 * 0x1000 + (ulong)(array->element).mutable_ ^
         uVar1;
}

Assistant:

size_t hash<wasm::Array>::operator()(const wasm::Array& array) const {
  return wasm::hash(array.element);
}